

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

float * Jf_ManInitRefs(Jf_Man_t *pMan)

{
  uint uVar1;
  Gia_Man_t *p;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  int iVar8;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  
  p = pMan->pGia;
  if (p->pRefs == (int *)0x0) {
    iVar2 = p->nObjs;
    piVar3 = (int *)calloc((long)iVar2,4);
    p->pRefs = piVar3;
    iVar8 = 0;
    while ((iVar8 < iVar2 && (pGVar4 = Gia_ManObj(p,iVar8), pGVar4 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
        Gia_ObjRefFanin0Inc(p,pGVar4);
        iVar2 = Gia_ObjIsBuf(pGVar4);
        if (iVar2 == 0) {
          Gia_ObjRefInc(p,pGVar4 + -(ulong)(*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
          iVar2 = Gia_ObjIsMuxType(pGVar4);
          if (iVar2 != 0) {
            pGVar4 = Gia_ObjRecognizeMux(pGVar4,&pData1,&pData0);
            Gia_ObjRefDec(p,(Gia_Obj_t *)((ulong)pGVar4 & 0xfffffffffffffffe));
            if ((Gia_Obj_t *)((ulong)pData1 & 0xfffffffffffffffe) ==
                (Gia_Obj_t *)((ulong)pData0 & 0xfffffffffffffffe)) {
              Gia_ObjRefDec(p,(Gia_Obj_t *)((ulong)pData1 & 0xfffffffffffffffe));
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
      iVar2 = p->nObjs;
    }
    iVar2 = 0;
    while ((iVar2 < p->vCos->nSize && (pGVar4 = Gia_ManCo(p,iVar2), pGVar4 != (Gia_Obj_t *)0x0))) {
      Gia_ObjRefFanin0Inc(p,pGVar4);
      iVar2 = iVar2 + 1;
    }
    if (pMan->pPars->fCoarsen != 0) {
      pMan->nCoarse = 0;
      iVar2 = 0;
      while ((iVar2 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar2), pGVar4 != (Gia_Obj_t *)0x0))) {
        if (((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) &&
           (iVar8 = Gia_ObjIsMuxType(pGVar4), iVar8 != 0)) {
          iVar8 = Gia_ObjRefNum(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
          if (iVar8 == 1) {
            *(ulong *)(pGVar4 + (-(*(ulong *)pGVar4 & 0x1fffffff) -
                                (*(ulong *)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff)) & 0x1fffffff)
                                )) =
                 *(ulong *)(pGVar4 + (-(*(ulong *)pGVar4 & 0x1fffffff) -
                                     (*(ulong *)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff)) &
                                     0x1fffffff))) & 0xffffffffbfffffff;
            uVar5 = (ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff;
            *(ulong *)(pGVar4 + (-uVar5 - (*(ulong *)(pGVar4 + -uVar5) & 0x1fffffff))) =
                 *(ulong *)(pGVar4 + (-uVar5 - (*(ulong *)(pGVar4 + -uVar5) & 0x1fffffff))) &
                 0xffffffffbfffffff;
            Jf_ObjCleanUnit(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
            pMan->nCoarse = pMan->nCoarse + 1;
          }
          iVar8 = Gia_ObjRefNum(p,pGVar4 + -(ulong)(*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
          if (iVar8 == 1) {
            *(ulong *)(pGVar4 + (-(*(ulong *)pGVar4 & 0x1fffffff) -
                                ((ulong)*(uint *)&pGVar4[-(*(ulong *)pGVar4 & 0x1fffffff)].field_0x4
                                & 0x1fffffff))) =
                 *(ulong *)(pGVar4 + (-(*(ulong *)pGVar4 & 0x1fffffff) -
                                     ((ulong)*(uint *)&pGVar4[-(*(ulong *)pGVar4 & 0x1fffffff)].
                                                       field_0x4 & 0x1fffffff))) &
                 0xffffffffbfffffff;
            uVar5 = (ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff;
            *(ulong *)(pGVar4 + (-uVar5 - ((ulong)*(uint *)&pGVar4[-uVar5].field_0x4 & 0x1fffffff)))
                 = *(ulong *)(pGVar4 + (-uVar5 - ((ulong)*(uint *)&pGVar4[-uVar5].field_0x4 &
                                                 0x1fffffff))) & 0xffffffffbfffffff;
            Jf_ObjCleanUnit(pGVar4 + -((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
            pMan->nCoarse = pMan->nCoarse + 1;
          }
        }
        iVar2 = iVar2 + 1;
      }
    }
    uVar1 = p->nObjs;
    pfVar6 = (float *)malloc((long)(int)uVar1 << 2);
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = p->pRefs[uVar5];
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      pfVar6[uVar5] = (float)iVar2;
    }
    return pfVar6;
  }
  __assert_fail("p->pRefs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                ,0xfa,"float *Jf_ManInitRefs(Jf_Man_t *)");
}

Assistant:

float * Jf_ManInitRefs( Jf_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    float * pRes; int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjRefFanin0Inc( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        Gia_ObjRefFanin1Inc( p, pObj );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Gia_ObjRefDec( p, Gia_Regular(pCtrl) );
        if ( Gia_Regular(pData1) == Gia_Regular(pData0) )
            Gia_ObjRefDec( p, Gia_Regular(pData1) );
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjRefFanin0Inc( p, pObj );
    // mark XOR/MUX internal nodes, which are not used elsewhere
    if ( pMan->pPars->fCoarsen )
    {
        pMan->nCoarse = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin0(pObj)), pMan->nCoarse++;
            }
            if ( Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin1(pObj)), pMan->nCoarse++;
            }
        }
    }
    // multiply by factor
    pRes = ABC_ALLOC( float, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pRes[i] = Abc_MaxInt( 1, p->pRefs[i] );
    return pRes;
}